

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>
               (int *dummy)

{
  generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1> local_38;
  
  local_38.isZombie = false;
  local_38.flags = 0;
  local_38.data._3_5_ = 0;
  local_38.data._0_3_ = 0;
  local_38.allocptr._3_5_ = 0;
  local_38.allocptr._0_3_ = 0;
  local_38.ptr = (void *)0x0;
  nodecpp::platform::ptrwithdatastructsdefs::
  generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1>::throwNullptrOrZombieAccess
            (&local_38);
}

Assistant:

void testPtrStructsWithZombieProperty_(int* dummy)
{
	bool OK = true;
	TestStructT optimizedPtrWithZombiePproperty;

	if constexpr( secondPtr )
		optimizedPtrWithZombiePproperty.init();
	else
		optimizedPtrWithZombiePproperty.init(nullptr);

	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, !optimizedPtrWithZombiePproperty.is_zombie() );
	try { optimizedPtrWithZombiePproperty.get_dereferencable_ptr(); OK = false; } catch ( ... ) {}
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );
	try { optimizedPtrWithZombiePproperty.get_ptr(); } catch ( ... ) { OK = false; }
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );

	if constexpr( secondPtr )
		optimizedPtrWithZombiePproperty.init(dummy, dummy, 17);
	else
		optimizedPtrWithZombiePproperty.init(dummy);
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, !optimizedPtrWithZombiePproperty.is_zombie() );
	try { optimizedPtrWithZombiePproperty.get_dereferencable_ptr(); } catch ( ... ) { OK = false; }
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );
	try { optimizedPtrWithZombiePproperty.get_ptr(); } catch ( ... ) { OK = false; }
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );

	optimizedPtrWithZombiePproperty.set_zombie();
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, optimizedPtrWithZombiePproperty.is_zombie() );
	try { optimizedPtrWithZombiePproperty.get_ptr(); OK = false; } catch ( ... ) {}
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );
	try { optimizedPtrWithZombiePproperty.get_dereferencable_ptr(); OK = false; } catch ( ... ) {}
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );

	if constexpr( secondPtr )
	{
		NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, optimizedPtrWithZombiePproperty.is_zombie() );
		try { optimizedPtrWithZombiePproperty.get_allocated_ptr(); OK = false; } catch ( ... ) {}
		NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );
		try { optimizedPtrWithZombiePproperty.get_dereferencable_allocated_ptr(); OK = false; } catch ( ... ) {}
		NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );
	}
}